

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O0

CURLcode tftp_setup_connection(Curl_easy *data,connectdata *conn)

{
  char cVar1;
  char *pcStack_20;
  char command;
  char *type;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  conn->transport = '\x04';
  pcStack_20 = strstr((data->state).up.path,";mode=");
  if (pcStack_20 == (char *)0x0) {
    pcStack_20 = strstr((conn->host).rawalloc,";mode=");
  }
  if (pcStack_20 != (char *)0x0) {
    *pcStack_20 = '\0';
    cVar1 = Curl_raw_toupper(pcStack_20[6]);
    switch(cVar1) {
    case 'A':
    case 'N':
      *(uint *)&(data->state).field_0x7be =
           *(uint *)&(data->state).field_0x7be & 0xffffbfff | 0x4000;
      break;
    case 'I':
    case 'O':
    default:
      *(uint *)&(data->state).field_0x7be = *(uint *)&(data->state).field_0x7be & 0xffffbfff;
    }
  }
  return CURLE_OK;
}

Assistant:

static CURLcode tftp_setup_connection(struct Curl_easy *data,
                                      struct connectdata *conn)
{
  char *type;

  conn->transport = TRNSPRT_UDP;

  /* TFTP URLs support an extension like ";mode=<typecode>" that
   * we will try to get now! */
  type = strstr(data->state.up.path, ";mode=");

  if(!type)
    type = strstr(conn->host.rawalloc, ";mode=");

  if(type) {
    char command;
    *type = 0;                   /* it was in the middle of the hostname */
    command = Curl_raw_toupper(type[6]);

    switch(command) {
    case 'A': /* ASCII mode */
    case 'N': /* NETASCII mode */
      data->state.prefer_ascii = TRUE;
      break;

    case 'O': /* octet mode */
    case 'I': /* binary mode */
    default:
      /* switch off ASCII */
      data->state.prefer_ascii = FALSE;
      break;
    }
  }

  return CURLE_OK;
}